

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void activate_in_columns(ecs_world_t *world,ecs_query_t *query,ecs_map_t *component_map,
                        _Bool activate)

{
  ecs_entity_t *peVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  ecs_on_demand_in_t *peVar6;
  void *pvVar7;
  undefined7 in_register_00000009;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  pvVar4 = _ecs_vector_first((query->sig).columns,0x28,0x10);
  uVar3 = ecs_vector_count((query->sig).columns);
  iVar2 = (int)CONCAT71(in_register_00000009,activate);
  uVar10 = iVar2 - 1U | 1;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = 0;
  }
  uVar9 = 0;
  do {
    if (uVar9 == uVar5) {
      return;
    }
    if (*(int *)((long)pvVar4 + uVar9 * 0x28 + 8) == 1) {
      peVar6 = get_in_component(component_map,*(ecs_entity_t *)((long)pvVar4 + uVar9 * 0x28 + 0x10))
      ;
      _ecs_assert(true,0xc,(char *)0x0,"in != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x32);
      iVar8 = peVar6->count + uVar10;
      peVar6->count = iVar8;
      _ecs_assert((_Bool)((byte)~(byte)((uint)iVar8 >> 0x18) >> 7),0xc,(char *)0x0,"in->count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x36);
      if (peVar6->count < 0) {
        __assert_fail("in->count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x36,
                      "void activate_in_columns(ecs_world_t *, ecs_query_t *, ecs_map_t *, _Bool)");
      }
      if (peVar6->count == iVar2 && peVar6->systems != (ecs_vector_t *)0x0) {
        pvVar7 = _ecs_vector_first(peVar6->systems,8,0x10);
        uVar3 = ecs_vector_count(peVar6->systems);
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
          peVar1 = *(ecs_entity_t **)((long)pvVar7 + uVar11 * 8);
          iVar8 = (int)peVar1[1] + uVar10;
          *(int *)(peVar1 + 1) = iVar8;
          if (activate) {
            if (iVar8 == 1) {
              ecs_remove_entity(world,*peVar1,0x104);
            }
          }
          else if (iVar8 == 0) {
            ecs_add_entity(world,*peVar1,0x104);
          }
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static
void activate_in_columns(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_map_t *component_map,
    bool activate)
{
    ecs_sig_column_t *columns = ecs_vector_first(query->sig.columns, ecs_sig_column_t);
    int32_t i, count = ecs_vector_count(query->sig.columns);

    for (i = 0; i < count; i ++) {
        if (columns[i].inout_kind == EcsIn) {
            ecs_on_demand_in_t *in = get_in_component(
                component_map, columns[i].is.component);
            ecs_assert(in != NULL, ECS_INTERNAL_ERROR, NULL);

            in->count += activate ? 1 : -1;

            ecs_assert(in->count >= 0, ECS_INTERNAL_ERROR, NULL);

            /* If this is the first system that registers the in component, walk
             * over all already registered systems to enable them */
            if (in->systems && 
               ((activate && in->count == 1) || 
                (!activate && !in->count))) 
            {
                ecs_on_demand_out_t **out = ecs_vector_first(
                    in->systems, ecs_on_demand_out_t*);
                int32_t s, in_count = ecs_vector_count(in->systems);

                for (s = 0; s < in_count; s ++) {
                    /* Increase the count of the system with the out params */
                    out[s]->count += activate ? 1 : -1;
                    
                    /* If this is the first out column that is requested from
                     * the OnDemand system, enable it */
                    if (activate && out[s]->count == 1) {
                        ecs_remove_entity(world, out[s]->system, EcsDisabledIntern);
                    } else if (!activate && !out[s]->count) {
                        ecs_add_entity(world, out[s]->system, EcsDisabledIntern);             
                    }
                }
            }
        }
    }    
}